

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::Message,google::protobuf::UnknownFieldSet>
          (ExtensionSet *this,char *ptr,Message *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte bVar1;
  DescriptorPool *pDVar2;
  MessageFactory *pMVar3;
  ushort *p_00;
  bool bVar4;
  MessageLite *this_00;
  string *psVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int field_number;
  ulong uVar10;
  ushort *p_01;
  UnknownFieldSet *this_01;
  char *p;
  int iVar11;
  string_view flat;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_int> pVar13;
  Metadata MVar14;
  bool was_packed_on_wire;
  string payload;
  string tmp;
  ExtensionInfo extension;
  bool local_121;
  ushort *local_120;
  InternalMetadata *local_118;
  DescriptorPool *local_110;
  Data *local_108;
  char *local_100;
  size_t local_f8;
  char local_f0;
  undefined7 uStack_ef;
  uint64_t local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [104];
  undefined8 uStack_60;
  MessageLite *local_58;
  undefined8 uStack_50;
  FieldDescriptor *local_48;
  undefined8 uStack_40;
  
  local_100 = &local_f0;
  local_f8 = 0;
  local_f0 = '\0';
  local_108 = &ctx->data_;
  iVar11 = 0;
  uVar10 = 0;
  local_120 = (ushort *)ptr;
  local_118 = metadata;
  local_110 = (DescriptorPool *)extendee;
LAB_00fe57ec:
  do {
    local_e0 = (uVar10 & 0xffffffff) * 8 + 2;
LAB_00fe57fb:
    do {
      bVar4 = EpsCopyInputStream::DoneWithCheck<false>
                        (&ctx->super_EpsCopyInputStream,(char **)&local_120,ctx->group_depth_);
      p_00 = local_120;
      p_01 = local_120;
      if (bVar4) goto LAB_00fe5be2;
      p_01 = (ushort *)((long)local_120 + 1);
      bVar1 = (byte)*local_120;
      uVar9 = (uint)bVar1;
      if (bVar1 != 0x10) {
        if (bVar1 == 0x1a) {
          if (iVar11 != 1) {
            local_d8._0_8_ = local_d8 + 0x10;
            local_d8._8_8_ = (MessageFactory *)0x0;
            local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
            bVar1 = *(byte *)p_01;
            uVar9 = (uint)bVar1;
            if ((char)bVar1 < '\0') {
              local_120 = p_01;
              pVar13 = ReadSizeFallback((char *)p_01,(uint)bVar1);
              uVar9 = pVar13.second;
              local_120 = (ushort *)pVar13.first;
              if (local_120 != (ushort *)0x0) goto LAB_00fe5961;
LAB_00fe5997:
              bVar4 = false;
            }
            else {
              local_120 = local_120 + 1;
LAB_00fe5961:
              local_120 = (ushort *)
                          EpsCopyInputStream::ReadString
                                    (&ctx->super_EpsCopyInputStream,(char *)local_120,uVar9,
                                     (string *)local_d8);
              if (local_120 == (ushort *)0x0) goto LAB_00fe5997;
              bVar4 = true;
              if (iVar11 == 0) {
                std::__cxx11::string::operator=((string *)&local_100,(string *)local_d8);
                iVar11 = 2;
              }
            }
            if ((DescriptorPool *)local_d8._0_8_ != (DescriptorPool *)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
            }
            if (!bVar4) goto LAB_00fe5bdf;
            goto LAB_00fe57fb;
          }
          local_120 = p_01;
          local_120 = (ushort *)
                      ParseField(this,local_e0,(char *)p_01,(Message *)local_110,local_118,ctx);
          iVar11 = 3;
        }
        else {
          if ((char)bVar1 < '\0') {
            uVar9 = ((uint)bVar1 + (uint)*(byte *)p_01 * 0x80) - 0x80;
            if ((char)*(byte *)p_01 < '\0') {
              local_120 = p_01;
              pVar12 = ReadTagFallback((char *)p_00,uVar9);
              uVar9 = pVar12.second;
              p_01 = (ushort *)pVar12.first;
            }
            else {
              p_01 = local_120 + 1;
            }
          }
          local_120 = p_01;
          if ((uVar9 == 0) || ((uVar9 & 7) == 4)) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
            goto LAB_00fe5be2;
          }
          local_120 = (ushort *)
                      ParseField(this,(ulong)uVar9,(char *)p_01,(Message *)local_110,local_118,ctx);
        }
        if (local_120 == (ushort *)0x0) goto LAB_00fe5bdf;
        goto LAB_00fe57fb;
      }
      uVar7 = (uint)(char)*p_01;
      uVar9 = (*p_01 & uVar7) + uVar7;
      uVar10 = (ulong)(uVar9 >> 1);
      if ((short)uVar9 < 0) {
        uVar10 = (ulong)(uVar9 >> 1);
        p_01 = (ushort *)((long)local_120 + 3);
        lVar8 = 0xd;
        while( true ) {
          uVar7 = (uint)(char)*p_01;
          uVar9 = (*p_01 & uVar7) + uVar7;
          uVar10 = ((ulong)uVar9 - 2 << ((byte)lVar8 & 0x3f)) + uVar10;
          if (-1 < (short)uVar9) break;
          lVar8 = lVar8 + 0xe;
          p_01 = p_01 + 1;
          if (lVar8 == 0x45) {
            local_120 = (ushort *)0x0;
            goto LAB_00fe5bdf;
          }
        }
        bVar4 = uVar9 < uVar7;
      }
      else {
        bVar4 = uVar9 < uVar7;
      }
      local_120 = (ushort *)((long)p_01 + (ulong)bVar4 + 1);
      field_number = (int)uVar10;
      if (field_number == 0) goto LAB_00fe5bdf;
      if (iVar11 == 0) {
        iVar11 = 1;
        goto LAB_00fe57ec;
      }
    } while (iVar11 != 2);
    local_48 = (FieldDescriptor *)0x0;
    uStack_40 = 0;
    local_58 = (MessageLite *)0x0;
    uStack_50 = 0;
    local_c8._96_8_ = 0;
    uStack_60 = 0;
    pDVar2 = local_108->pool;
    if (pDVar2 == (DescriptorPool *)0x0) {
      local_d8._0_8_ = local_110;
      bVar4 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                        (this,2,field_number,(GeneratedExtensionFinder *)local_d8,
                         (ExtensionInfo *)(local_c8 + 0x60),&local_121);
    }
    else {
      pMVar3 = (ctx->data_).factory;
      MVar14 = Message::GetMetadata((Message *)local_110);
      local_c8._0_8_ = MVar14.descriptor;
      local_d8._0_8_ = pDVar2;
      local_d8._8_8_ = pMVar3;
      bVar4 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::DescriptorPoolExtensionFinder>
                        (this,2,field_number,(DescriptorPoolExtensionFinder *)local_d8,
                         (ExtensionInfo *)(local_c8 + 0x60),&local_121);
    }
    pcVar6 = local_100;
    if (bVar4 == false) {
      if ((local_118->ptr_ & 1U) == 0) {
        this_01 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                            (local_118);
      }
      else {
        this_01 = (UnknownFieldSet *)((local_118->ptr_ & 0xfffffffffffffffeU) + 8);
      }
      psVar5 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_01,field_number);
      std::__cxx11::string::_M_replace
                ((ulong)psVar5,0,(char *)psVar5->_M_string_length,(ulong)pcVar6);
      iVar11 = 3;
    }
    else {
      if (uStack_60._5_1_ == '\x01') {
        this_00 = AddMessage(this,field_number,'\v',local_58,local_48);
      }
      else {
        this_00 = MutableMessage(this,field_number,'\v',local_58,local_48);
      }
      local_c8[0x30] = '\0';
      local_c8[0x31] = '\0';
      local_c8[0x32] = '\0';
      local_c8[0x33] = '\0';
      local_c8[0x34] = '\0';
      local_c8[0x35] = '\0';
      local_c8[0x36] = '\0';
      local_c8[0x37] = '\0';
      local_c8._56_8_ = 0;
      local_c8[0x20] = '\0';
      local_c8[0x21] = '\0';
      local_c8[0x22] = '\0';
      local_c8[0x23] = '\0';
      local_c8[0x24] = '\0';
      local_c8[0x25] = '\0';
      local_c8[0x26] = '\0';
      local_c8[0x27] = '\0';
      local_c8[0x28] = '\0';
      local_c8[0x29] = '\0';
      local_c8[0x2a] = '\0';
      local_c8[0x2b] = '\0';
      local_c8[0x2c] = '\0';
      local_c8[0x2d] = '\0';
      local_c8[0x2e] = '\0';
      local_c8[0x2f] = '\0';
      local_c8._16_8_ = (ZeroCopyInputStream *)0x0;
      local_c8[0x18] = '\0';
      local_c8[0x19] = '\0';
      local_c8[0x1a] = '\0';
      local_c8[0x1b] = '\0';
      local_c8[0x1c] = '\0';
      local_c8[0x1d] = '\0';
      local_c8[0x1e] = '\0';
      local_c8[0x1f] = '\0';
      local_c8._64_4_ = 0;
      local_c8._68_4_ = 0x7fffffff;
      local_c8._72_4_ = ctx->depth_;
      local_c8._76_4_ = -0x80000000;
      local_c8._80_8_ = local_108->pool;
      local_c8._88_8_ = local_108->factory;
      flat._M_str = local_100;
      flat._M_len = local_f8;
      pcVar6 = EpsCopyInputStream::InitFrom((EpsCopyInputStream *)local_d8,flat);
      pcVar6 = MessageLite::_InternalParse(this_00,pcVar6,(ParseContext *)local_d8);
      if ((pcVar6 == (char *)0x0) || (iVar11 = 3, local_c8._64_4_ != 0)) {
LAB_00fe5bdf:
        p_01 = (ushort *)0x0;
LAB_00fe5be2:
        if (local_100 != &local_f0) {
          operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
        }
        return (char *)p_01;
      }
    }
  } while( true );
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  enum class State { kNoTag, kHasType, kHasPayload, kDone };
  State state = State::kNoTag;

  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      // We should fail parsing if type id is 0 after cast to uint32.
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                     static_cast<uint32_t>(tmp) != 0);
      if (state == State::kNoTag) {
        type_id = static_cast<uint32_t>(tmp);
        state = State::kHasType;
      } else if (state == State::kHasPayload) {
        type_id = static_cast<uint32_t>(tmp);
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools. Spawn a new
          // ParseContext inheriting those attributes.
          ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        state = State::kDone;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (state == State::kHasType) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        state = State::kDone;
      } else {
        std::string tmp;
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        if (state == State::kNoTag) {
          payload = std::move(tmp);
          state = State::kHasPayload;
        }
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}